

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cc
# Opt level: O1

NativeCallback * __thiscall flow::Runtime::registerHandler(Runtime *this,string *name)

{
  tuple<flow::NativeCallback_*,_std::default_delete<flow::NativeCallback>_> this_00;
  __uniq_ptr_impl<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_> local_20;
  
  this_00.super__Tuple_impl<0UL,_flow::NativeCallback_*,_std::default_delete<flow::NativeCallback>_>
  .super__Head_base<0UL,_flow::NativeCallback_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_flow::NativeCallback_*,_std::default_delete<flow::NativeCallback>_>)
       operator_new(200);
  NativeCallback::NativeCallback
            ((NativeCallback *)
             this_00.
             super__Tuple_impl<0UL,_flow::NativeCallback_*,_std::default_delete<flow::NativeCallback>_>
             .super__Head_base<0UL,_flow::NativeCallback_*,_false>._M_head_impl,this,name);
  local_20._M_t.
  super__Tuple_impl<0UL,_flow::NativeCallback_*,_std::default_delete<flow::NativeCallback>_>.
  super__Head_base<0UL,_flow::NativeCallback_*,_false>._M_head_impl =
       (tuple<flow::NativeCallback_*,_std::default_delete<flow::NativeCallback>_>)
       (tuple<flow::NativeCallback_*,_std::default_delete<flow::NativeCallback>_>)
       this_00.
       super__Tuple_impl<0UL,_flow::NativeCallback_*,_std::default_delete<flow::NativeCallback>_>.
       super__Head_base<0UL,_flow::NativeCallback_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<flow::NativeCallback,std::default_delete<flow::NativeCallback>>,std::allocator<std::unique_ptr<flow::NativeCallback,std::default_delete<flow::NativeCallback>>>>
  ::emplace_back<std::unique_ptr<flow::NativeCallback,std::default_delete<flow::NativeCallback>>>
            ((vector<std::unique_ptr<flow::NativeCallback,std::default_delete<flow::NativeCallback>>,std::allocator<std::unique_ptr<flow::NativeCallback,std::default_delete<flow::NativeCallback>>>>
              *)&this->builtins_,
             (unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_> *)
             &local_20);
  std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>::~unique_ptr
            ((unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_> *)
             &local_20);
  return (this->builtins_).
         super__Vector_base<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>.
         _M_t.
         super__Tuple_impl<0UL,_flow::NativeCallback_*,_std::default_delete<flow::NativeCallback>_>.
         super__Head_base<0UL,_flow::NativeCallback_*,_false>._M_head_impl;
}

Assistant:

NativeCallback& Runtime::registerHandler(const std::string& name) {
  builtins_.push_back(std::make_unique<NativeCallback>(this, name));
  return *builtins_[builtins_.size() - 1];
}